

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlParseChunk(htmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar **ppxVar1;
  int *piVar2;
  byte bVar3;
  setDocumentLocatorSAXFunc p_Var4;
  void *pvVar5;
  xmlChar *pxVar6;
  endElementSAXFunc p_Var7;
  __int32_t *p_Var8;
  endDocumentSAXFunc p_Var9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  xmlParserInputState xVar13;
  size_t sVar14;
  xmlSAXLocator *pxVar15;
  __int32_t **pp_Var16;
  _xmlSAXHandler *p_Var17;
  charactersSAXFunc p_Var18;
  byte *pbVar19;
  xmlDtdPtr pxVar20;
  xmlChar *pxVar21;
  char *pcVar22;
  xmlParserErrors error;
  undefined8 in_R8;
  xmlChar *pxVar23;
  xmlParserInputPtr pxVar24;
  byte bVar25;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  htmlParserNodeInfo node_info;
  ushort local_5e;
  uint local_5c;
  htmlParserNodeInfo local_58;
  
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,5,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,(char *)0x0,
                    0,0,"htmlParseChunk: context error\n",0,0);
    return 1;
  }
  pxVar24 = ctxt->input;
  if (pxVar24 == (xmlParserInputPtr)0x0) {
    pcVar22 = "htmlParseChunk: context error\n";
    iVar12 = 1;
    error = XML_ERR_INTERNAL_ERROR;
LAB_0014e645:
    htmlParseErr(ctxt,error,pcVar22,(xmlChar *)0x0,(xmlChar *)0x0);
    return iVar12;
  }
  if (((chunk == (char *)0x0 || size < 1) || (pxVar24->buf == (xmlParserInputBufferPtr)0x0)) ||
     (ctxt->instate == XML_PARSER_EOF)) {
    if (((ctxt->instate != XML_PARSER_EOF) &&
        (chunk = (char *)pxVar24->buf,
        (xmlParserInputBufferPtr)chunk != (xmlParserInputBufferPtr)0x0)) &&
       ((((xmlParserInputBufferPtr)chunk)->encoder != (xmlCharEncodingHandlerPtr)0x0 &&
        ((((xmlParserInputBufferPtr)chunk)->buffer != (xmlBufPtr)0x0 &&
         (((xmlParserInputBufferPtr)chunk)->raw != (xmlBufPtr)0x0)))))) {
      sVar14 = xmlBufGetInputBase(((xmlParserInputBufferPtr)chunk)->buffer,pxVar24);
      pxVar21 = ctxt->input->cur;
      pxVar23 = ctxt->input->base;
      iVar12 = xmlCharEncInput((xmlParserInputBufferPtr)chunk,terminate);
      xmlBufSetInputBaseCur
                (((xmlParserInputBufferPtr)chunk)->buffer,ctxt->input,sVar14,
                 (long)pxVar21 - (long)pxVar23);
      if (iVar12 < 0) {
        pcVar22 = "encoder error\n";
        iVar12 = 0x51;
        error = XML_ERR_INVALID_ENCODING;
        goto LAB_0014e645;
      }
    }
  }
  else {
    sVar14 = xmlBufGetInputBase(pxVar24->buf->buffer,pxVar24);
    pxVar24 = ctxt->input;
    pxVar21 = pxVar24->cur;
    pxVar23 = pxVar24->base;
    uVar11 = xmlParserInputBufferPush(pxVar24->buf,size,chunk);
    chunk = (char *)(ulong)uVar11;
    xmlBufSetInputBaseCur(ctxt->input->buf->buffer,ctxt->input,sVar14,(long)pxVar21 - (long)pxVar23)
    ;
    if ((int)uVar11 < 0) {
      ctxt->errNo = -1;
      ctxt->disableSAX = 1;
      return -1;
    }
  }
  pxVar24 = ctxt->input;
  bVar28 = true;
  if (pxVar24 == (xmlParserInputPtr)0x0) goto LAB_0014e675;
  uVar26 = CONCAT71((int7)((ulong)chunk >> 8),terminate != 0);
LAB_0014d8c4:
  if (pxVar24->buf == (xmlParserInputBufferPtr)0x0) {
    sVar14 = (size_t)pxVar24->length;
  }
  else {
    sVar14 = xmlBufUse(pxVar24->buf->buffer);
  }
  pxVar21 = pxVar24->base;
  pbVar19 = pxVar24->cur;
  pxVar23 = pxVar21 + (sVar14 - (long)pbVar19);
  if ((terminate != 0) && (pxVar23 == (xmlChar *)0x0)) {
    htmlAutoCloseOnEnd(ctxt);
    if (ctxt->nameNr == 0) {
      bVar28 = true;
      if (ctxt->instate != XML_PARSER_EOF) {
        ctxt->instate = XML_PARSER_EOF;
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           (p_Var9 = ctxt->sax->endDocument, p_Var9 != (endDocumentSAXFunc)0x0)) {
          (*p_Var9)(ctxt->userData);
        }
      }
    }
    else {
      bVar28 = true;
    }
    goto LAB_0014e675;
  }
  if ((long)pxVar23 < 1) goto LAB_0014e654;
  bVar25 = *pbVar19;
  if (bVar25 == 0) {
    pxVar24 = ctxt->input;
    ppxVar1 = &pxVar24->cur;
    *ppxVar1 = *ppxVar1 + 1;
    piVar2 = &pxVar24->col;
    *piVar2 = *piVar2 + 1;
    goto switchD_0014d922_default;
  }
  uVar11 = (uint)uVar26;
  switch(ctxt->instate) {
  case XML_PARSER_START:
    if ((bVar25 < 0x21) && ((0x100002600U >> ((ulong)bVar25 & 0x3f) & 1) != 0)) {
      htmlSkipBlankChars(ctxt);
      if (pxVar24->buf == (xmlParserInputBufferPtr)0x0) {
        sVar14 = (size_t)pxVar24->length;
      }
      else {
        sVar14 = xmlBufUse(pxVar24->buf->buffer);
      }
      pxVar23 = pxVar24->base + (sVar14 - (long)pxVar24->cur);
    }
    p_Var17 = ctxt->sax;
    if (p_Var17 != (_xmlSAXHandler *)0x0) {
      p_Var4 = p_Var17->setDocumentLocator;
      if (p_Var4 != (setDocumentLocatorSAXFunc)0x0) {
        pvVar5 = ctxt->userData;
        local_5c = uVar11;
        pxVar15 = __xmlDefaultSAXLocator();
        uVar26 = (ulong)local_5c;
        (*p_Var4)(pvVar5,pxVar15);
        p_Var17 = ctxt->sax;
        if (p_Var17 == (_xmlSAXHandler *)0x0) goto LAB_0014df43;
      }
      if ((p_Var17->startDocument != (startDocumentSAXFunc)0x0) && (ctxt->disableSAX == 0)) {
        (*p_Var17->startDocument)(ctxt->userData);
      }
    }
LAB_0014df43:
    if ((*pxVar24->cur == '<') && (pxVar24->cur[1] == '!')) {
      pp_Var16 = __ctype_toupper_loc();
      p_Var8 = *pp_Var16;
      pxVar21 = ctxt->input->cur;
      if (((p_Var8[pxVar21[2]] == 0x44) &&
          (((p_Var8[pxVar21[3]] == 0x4f && (p_Var8[pxVar21[4]] == 0x43)) &&
           (p_Var8[pxVar21[5]] == 0x54)))) &&
         (((p_Var8[pxVar21[6]] == 0x59 && (p_Var8[pxVar21[7]] == 0x50)) &&
          (p_Var8[pxVar21[8]] == 0x45)))) {
joined_r0x0014e069:
        if ((terminate != 0) ||
           (iVar12 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8), -1 < iVar12)) {
          htmlParseDocTypeDecl(ctxt);
          goto LAB_0014de06;
        }
        goto LAB_0014e7f7;
      }
    }
    ctxt->instate = XML_PARSER_MISC;
    goto switchD_0014d922_default;
  case XML_PARSER_MISC:
    htmlSkipBlankChars(ctxt);
    if (pxVar24->buf == (xmlParserInputBufferPtr)0x0) {
      sVar14 = (size_t)pxVar24->length;
    }
    else {
      sVar14 = xmlBufUse(pxVar24->buf->buffer);
    }
    pbVar19 = pxVar24->cur;
    pxVar23 = pxVar24->base + (sVar14 - (long)pbVar19);
    if ((long)pxVar23 < 1) goto LAB_0014e654;
    if (pxVar23 == &DAT_00000001) {
      if (terminate != 0) goto LAB_0014e53e;
    }
    else {
      if (pbVar19[1] == 0x21 && (*pbVar19 ^ 0x3c) == 0) {
        if ((pbVar19[2] == 0x2d) && (pbVar19[3] == 0x2d)) {
          if ((terminate != 0) || (iVar12 = htmlParseLookupCommentEnd(ctxt), -1 < iVar12)) {
            htmlParseComment(ctxt);
LAB_0014e002:
            ctxt->instate = XML_PARSER_MISC;
            goto switchD_0014d922_default;
          }
          goto LAB_0014e7f7;
        }
        pp_Var16 = __ctype_toupper_loc();
        p_Var8 = *pp_Var16;
        pxVar21 = ctxt->input->cur;
        if (((p_Var8[pxVar21[2]] == 0x44) &&
            (((p_Var8[pxVar21[3]] == 0x4f && (p_Var8[pxVar21[4]] == 0x43)) &&
             (p_Var8[pxVar21[5]] == 0x54)))) &&
           (((p_Var8[pxVar21[6]] == 0x59 && (p_Var8[pxVar21[7]] == 0x50)) &&
            (p_Var8[pxVar21[8]] == 0x45)))) goto joined_r0x0014e069;
        if (&DAT_00000008 < pxVar23) goto LAB_0014e53e;
        goto switchD_0014d922_caseD_ffffffff;
      }
      if ((*pbVar19 ^ 0x3c) != 0 || pbVar19[1] != 0x3f) goto LAB_0014e53e;
      if ((terminate != 0) ||
         (iVar12 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar12)) {
        htmlParsePI(ctxt);
        goto LAB_0014e002;
      }
    }
    goto LAB_0014e7f7;
  case XML_PARSER_PI:
    pcVar22 = "HPP: internal error, state == PI\n";
    break;
  case XML_PARSER_DTD:
    pcVar22 = "HPP: internal error, state == DTD\n";
    break;
  case XML_PARSER_PROLOG:
    htmlSkipBlankChars(ctxt);
    if (pxVar24->buf == (xmlParserInputBufferPtr)0x0) {
      sVar14 = (size_t)pxVar24->length;
    }
    else {
      sVar14 = xmlBufUse(pxVar24->buf->buffer);
    }
    pbVar19 = pxVar24->cur;
    pxVar23 = pxVar24->base + (sVar14 - (long)pbVar19);
    if (1 < (long)pxVar23) {
      if (pbVar19[1] == 0x21 && (*pbVar19 ^ 0x3c) == 0) {
        if ((pbVar19[2] == 0x2d) && (pbVar19[3] == 0x2d)) {
          if ((terminate == 0) && (iVar12 = htmlParseLookupCommentEnd(ctxt), iVar12 < 0))
          goto LAB_0014e7f7;
          htmlParseComment(ctxt);
LAB_0014de06:
          ctxt->instate = XML_PARSER_PROLOG;
          goto switchD_0014d922_default;
        }
        if (pxVar23 <= &DAT_00000003) goto switchD_0014d922_caseD_ffffffff;
      }
      else if ((*pbVar19 ^ 0x3c) == 0 && pbVar19[1] == 0x3f) {
        if ((terminate != 0) ||
           (iVar12 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar12)) {
          htmlParsePI(ctxt);
          goto LAB_0014de06;
        }
        goto LAB_0014e7f7;
      }
LAB_0014e53e:
      ctxt->instate = XML_PARSER_CONTENT;
      goto switchD_0014d922_default;
    }
    goto LAB_0014e654;
  case XML_PARSER_COMMENT:
    pcVar22 = "HPP: internal error, state == COMMENT\n";
    break;
  case XML_PARSER_START_TAG:
    if (pxVar23 != &DAT_00000001) {
      if (bVar25 != 0x3c) goto LAB_0014e53e;
      if (pbVar19[1] == 0x2f) {
        ctxt->instate = XML_PARSER_END_TAG;
        goto LAB_0014dc10;
      }
      if ((terminate != 0) ||
         (iVar12 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8), -1 < iVar12))
      goto LAB_0014e0c3;
      goto LAB_0014e7f7;
    }
    if (terminate == 0) goto LAB_0014e7f7;
    if (bVar25 != 0x3c) goto LAB_0014e53e;
LAB_0014e0c3:
    if (ctxt->record_info != 0) {
      pxVar24 = ctxt->input;
      local_58.begin_pos = (unsigned_long)(pxVar24->cur + (pxVar24->consumed - (long)pxVar24->base))
      ;
      local_58.begin_line = (unsigned_long)pxVar24->line;
    }
    iVar12 = htmlParseStartTag(ctxt);
    pxVar21 = ctxt->name;
    if (pxVar21 != (xmlChar *)0x0 && iVar12 != -1) {
      lVar27 = 0;
      local_5c = uVar11;
      do {
        iVar12 = xmlStrcasecmp(pxVar21,*(xmlChar **)((long)&html40ElementTable[0].name + lVar27));
        if (iVar12 == 0) {
          lVar27 = (long)&html40ElementTable[0].name + lVar27;
          goto LAB_0014e17f;
        }
        lVar27 = lVar27 + 0x40;
      } while (lVar27 != 0x1700);
      in_R8 = 0;
      htmlParseErr(ctxt,XML_HTML_UNKNOWN_TAG,"Tag %s invalid\n",pxVar21,(xmlChar *)0x0);
      lVar27 = 0;
LAB_0014e17f:
      pxVar24 = ctxt->input;
      pxVar6 = pxVar24->cur;
      if (*pxVar6 != '>') {
        if ((*pxVar6 == '/') && (pxVar6[1] == '>')) {
          pxVar24->cur = pxVar6 + 2;
          pxVar24->col = pxVar24->col + 2;
          uVar26 = (ulong)local_5c;
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (p_Var7 = ctxt->sax->endElement, p_Var7 != (endElementSAXFunc)0x0)) {
            (*p_Var7)(ctxt->userData,pxVar21);
          }
          iVar12 = ctxt->nameNr;
          if (0 < (long)iVar12) {
            ctxt->nameNr = iVar12 - 1U;
            if (iVar12 == 1) {
              pxVar21 = (xmlChar *)0x0;
            }
            else {
              pxVar21 = ctxt->nameTab[(long)iVar12 + -2];
            }
            ctxt->name = pxVar21;
            ctxt->nameTab[iVar12 - 1U] = (xmlChar *)0x0;
          }
        }
        else {
          in_R8 = 0;
          htmlParseErr(ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s\n",pxVar21,
                       (xmlChar *)0x0);
          iVar12 = xmlStrEqual(pxVar21,ctxt->name);
          uVar26 = (ulong)local_5c;
          if (iVar12 != 0) {
            nodePop(ctxt);
            iVar12 = ctxt->nameNr;
            if (0 < (long)iVar12) {
              ctxt->nameNr = iVar12 - 1U;
              if (iVar12 == 1) {
                pxVar21 = (xmlChar *)0x0;
              }
              else {
                pxVar21 = ctxt->nameTab[(long)iVar12 + -2];
              }
              ctxt->name = pxVar21;
              ctxt->nameTab[iVar12 - 1U] = (xmlChar *)0x0;
            }
          }
          if (ctxt->record_info != 0) {
            htmlNodeInfoPush(ctxt,&local_58);
          }
        }
        goto LAB_0014e53e;
      }
      xmlNextChar(ctxt);
      uVar26 = (ulong)local_5c;
      if ((iVar12 == 0) && (*(char *)(lVar27 + 0xb) != '\0')) {
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           (p_Var7 = ctxt->sax->endElement, p_Var7 != (endElementSAXFunc)0x0)) {
          (*p_Var7)(ctxt->userData,pxVar21);
        }
        iVar12 = ctxt->nameNr;
        if (0 < (long)iVar12) {
          ctxt->nameNr = iVar12 - 1U;
          if (iVar12 == 1) {
            pxVar21 = (xmlChar *)0x0;
          }
          else {
            pxVar21 = ctxt->nameTab[(long)iVar12 + -2];
          }
          ctxt->name = pxVar21;
          ctxt->nameTab[iVar12 - 1U] = (xmlChar *)0x0;
        }
      }
      if (ctxt->record_info != 0) {
        htmlNodeInfoPush(ctxt,&local_58);
      }
      ctxt->instate = XML_PARSER_CONTENT;
      goto switchD_0014d922_default;
    }
    pxVar24 = ctxt->input;
    if (*pxVar24->cur == '>') {
      xmlNextChar(ctxt);
      goto switchD_0014d922_default;
    }
    goto LAB_0014dc1f;
  case XML_PARSER_CONTENT:
    local_5e = 0;
    if (ctxt->token != 0) {
      local_5e = (ushort)(byte)ctxt->token;
      htmlCheckParagraph(ctxt);
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var18 = ctxt->sax->characters, p_Var18 != (charactersSAXFunc)0x0)) {
        (*p_Var18)(ctxt->userData,(xmlChar *)&local_5e,1);
      }
      ctxt->token = 0;
      ctxt->checkIndex = 0;
    }
    if ((terminate != 0) && (pxVar23 == &DAT_00000001)) {
      bVar25 = *pxVar24->cur;
      local_5c = uVar11;
      if ((bVar25 == 0x26) || (bVar25 == 0x3c)) goto LAB_0014e7ff;
      p_Var17 = ctxt->sax;
      if (p_Var17 != (_xmlSAXHandler *)0x0) {
        local_5e = CONCAT11(local_5e._1_1_,bVar25);
        if ((bVar25 < 0x21) && ((0x100002600U >> ((ulong)(uint)bVar25 & 0x3f) & 1) != 0)) {
          if (ctxt->keepBlanks != 0) goto LAB_0014e388;
          p_Var18 = p_Var17->ignorableWhitespace;
        }
        else {
          htmlCheckParagraph(ctxt);
          p_Var17 = ctxt->sax;
LAB_0014e388:
          p_Var18 = p_Var17->characters;
        }
        if (p_Var18 != (charactersSAXFunc)0x0) {
          (*p_Var18)(ctxt->userData,(xmlChar *)&local_5e,1);
        }
      }
      ctxt->token = 0;
      ctxt->checkIndex = 0;
      pxVar24->cur = pxVar24->cur + 1;
LAB_0014e3bd:
      uVar26 = (ulong)local_5c;
      goto switchD_0014d922_default;
    }
    local_5c = uVar11;
    if (pxVar23 != &DAT_00000001) {
      bVar25 = *pxVar24->cur;
      bVar3 = pxVar24->cur[1];
      iVar12 = xmlStrEqual(ctxt->name,"script");
      if ((iVar12 != 0) || (iVar12 = xmlStrEqual(ctxt->name,"style"), iVar12 != 0)) {
        if (terminate == 0) {
          uVar11 = htmlParseLookupSequence(ctxt,'<','/','\0',(int)in_R8);
          if ((int)uVar11 < 0) goto LAB_0014e7ff;
          if (pxVar24->cur[(ulong)uVar11 + 2] == '\0') goto LAB_0014e7f7;
        }
        htmlParseScript(ctxt);
        if (bVar3 == 0x2f && bVar25 == 0x3c) {
          ctxt->instate = XML_PARSER_END_TAG;
          ctxt->checkIndex = 0;
        }
        goto LAB_0014e3bd;
      }
      bVar10 = bVar25 ^ 0x3c;
      if (bVar3 == 0x21 && bVar10 == 0) {
        pp_Var16 = __ctype_toupper_loc();
        p_Var8 = *pp_Var16;
        pxVar21 = ctxt->input->cur;
        if ((((((p_Var8[pxVar21[2]] == 0x44) && (p_Var8[pxVar21[3]] == 0x4f)) &&
              (p_Var8[pxVar21[4]] == 0x43)) &&
             ((p_Var8[pxVar21[5]] == 0x54 && (p_Var8[pxVar21[6]] == 0x59)))) &&
            (p_Var8[pxVar21[7]] == 0x50)) && (p_Var8[pxVar21[8]] == 0x45)) {
          if ((terminate != 0) ||
             (iVar12 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8), -1 < iVar12)) {
            in_R8 = 0;
            htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"Misplaced DOCTYPE declaration\n",
                         (xmlChar *)"DOCTYPE",(xmlChar *)0x0);
            htmlParseDocTypeDecl(ctxt);
            goto LAB_0014e3bd;
          }
        }
        else if ((pxVar24->cur[2] == '-') && (pxVar24->cur[3] == '-')) {
          if ((terminate != 0) || (iVar12 = htmlParseLookupCommentEnd(ctxt), -1 < iVar12)) {
            htmlParseComment(ctxt);
            goto LAB_0014e428;
          }
        }
        else if (&DAT_00000004 <= pxVar23) {
LAB_0014e441:
          in_R8 = 0;
          htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseTryOrFinish: invalid element name\n",
                       (xmlChar *)0x0,(xmlChar *)0x0);
          htmlCheckParagraph(ctxt);
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (p_Var18 = ctxt->sax->characters, p_Var18 != (charactersSAXFunc)0x0)) {
            (*p_Var18)(ctxt->userData,pxVar24->cur,1);
          }
          xmlNextChar(ctxt);
          goto LAB_0014e3bd;
        }
      }
      else if (bVar3 == 0x3f && bVar10 == 0) {
        if ((terminate != 0) ||
           (iVar12 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar12)) {
          htmlParsePI(ctxt);
LAB_0014e428:
          ctxt->instate = XML_PARSER_CONTENT;
          goto LAB_0014e3bd;
        }
      }
      else {
        if (bVar10 == 0 && bVar3 == 0x2f) {
          ctxt->instate = XML_PARSER_END_TAG;
LAB_0014e599:
          ctxt->checkIndex = 0;
          goto LAB_0014e3bd;
        }
        if (bVar25 == 0x3c) {
          if ((terminate != 0) || (bVar3 != 0)) {
            if ((0x19 < (byte)((bVar3 & 0xdf) + 0xbf)) &&
               ((0x31 < bVar3 - 0x2e ||
                ((0x2000000001001U >> ((ulong)(bVar3 - 0x2e) & 0x3f) & 1) == 0))))
            goto LAB_0014e441;
            ctxt->instate = XML_PARSER_START_TAG;
            goto LAB_0014e599;
          }
        }
        else if ((terminate != 0) ||
                (iVar12 = htmlParseLookupSequence(ctxt,'<','\0','\0',(int)in_R8), -1 < iVar12)) {
          ctxt->checkIndex = 0;
          pbVar19 = pxVar24->cur;
          do {
            if (pxVar24->end <= pbVar19) break;
            if (bVar25 == 0x26) {
              htmlParseReference(ctxt);
            }
            else {
              htmlParseCharDataInternal(ctxt,0);
            }
            pbVar19 = pxVar24->cur;
            bVar25 = *pbVar19;
          } while (bVar25 != 0x3c);
          goto LAB_0014e3bd;
        }
      }
    }
LAB_0014e7ff:
    uVar26 = (ulong)local_5c;
    goto switchD_0014d922_caseD_ffffffff;
  case XML_PARSER_CDATA_SECTION:
    pcVar22 = "HPP: internal error, state == CDATA\n";
    break;
  case XML_PARSER_END_TAG:
    if (pxVar23 == &DAT_00000001) goto switchD_0014d922_caseD_ffffffff;
    if ((terminate != 0) ||
       (iVar12 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar12)) {
      htmlParseEndTag(ctxt);
      xVar13 = XML_PARSER_CONTENT;
      if (ctxt->nameNr == 0) {
        xVar13 = XML_PARSER_EPILOG;
      }
      ctxt->instate = xVar13;
      goto LAB_0014dc10;
    }
LAB_0014e7f7:
    uVar26 = 0;
    goto switchD_0014d922_caseD_ffffffff;
  case XML_PARSER_ENTITY_DECL:
    pcVar22 = "HPP: internal error, state == ENTITY_DECL\n";
    break;
  case XML_PARSER_ENTITY_VALUE:
    pcVar22 = "HPP: internal error, state == ENTITY_VALUE\n";
    break;
  case XML_PARSER_ATTRIBUTE_VALUE:
    in_R8 = 0;
    htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"HPP: internal error, state == ATTRIBUTE_VALUE\n",
                 (xmlChar *)0x0,(xmlChar *)0x0);
    ctxt->instate = XML_PARSER_START_TAG;
    goto LAB_0014dc10;
  case XML_PARSER_SYSTEM_LITERAL:
    pcVar22 = "HPP: internal error, state == XML_PARSER_SYSTEM_LITERAL\n";
    break;
  case XML_PARSER_EPILOG:
    if (pxVar24->buf == (xmlParserInputBufferPtr)0x0) {
      sVar14 = (size_t)pxVar24->length;
    }
    else {
      sVar14 = xmlBufUse(pxVar24->buf->buffer);
      pxVar21 = pxVar24->base;
      pbVar19 = pxVar24->cur;
    }
    pxVar23 = pxVar21 + (sVar14 - (long)pbVar19);
    if (0 < (long)pxVar23) {
      bVar25 = *pbVar19;
      if (((ulong)bVar25 < 0x21) && ((0x100002600U >> ((ulong)bVar25 & 0x3f) & 1) != 0)) {
        htmlParseCharDataInternal(ctxt,0);
        goto switchD_0014d922_caseD_ffffffff;
      }
      if (pxVar23 == &DAT_00000001) goto switchD_0014d922_caseD_ffffffff;
      if (pbVar19[1] == 0x21 && bVar25 == 0x3c) {
        if ((pbVar19[2] == 0x2d) && (pbVar19[3] == 0x2d)) {
          if ((terminate == 0) && (iVar12 = htmlParseLookupCommentEnd(ctxt), iVar12 < 0))
          goto LAB_0014e7f7;
          htmlParseComment(ctxt);
LAB_0014decc:
          ctxt->instate = XML_PARSER_EPILOG;
          goto switchD_0014d922_default;
        }
        if (pxVar23 < &DAT_00000004) goto switchD_0014d922_caseD_ffffffff;
      }
      else if ((bVar25 == 0x3c) && (pbVar19[1] == 0x3f)) {
        if ((terminate != 0) ||
           (iVar12 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar12)) {
          htmlParsePI(ctxt);
          goto LAB_0014decc;
        }
        goto LAB_0014e7f7;
      }
      ctxt->errNo = 5;
      ctxt->wellFormed = 0;
      goto LAB_0014e763;
    }
    goto LAB_0014e654;
  case XML_PARSER_IGNORE:
    pcVar22 = "HPP: internal error, state == XML_PARSER_IGNORE\n";
    break;
  case XML_PARSER_PUBLIC_LITERAL:
    pcVar22 = "HPP: internal error, state == XML_PARSER_LITERAL\n";
    break;
  case XML_PARSER_EOF:
    goto switchD_0014d922_caseD_ffffffff;
  default:
    goto switchD_0014d922_default;
  }
  in_R8 = 0;
  htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,pcVar22,(xmlChar *)0x0,(xmlChar *)0x0);
  ctxt->instate = XML_PARSER_CONTENT;
LAB_0014dc10:
  ctxt->checkIndex = 0;
switchD_0014d922_default:
  pxVar24 = ctxt->input;
LAB_0014dc1f:
  if (pxVar24 == (xmlParserInputPtr)0x0) goto LAB_0014e654;
  goto LAB_0014d8c4;
LAB_0014e654:
  bVar28 = pxVar23 == (xmlChar *)0x0;
LAB_0014e675:
  uVar26 = (ulong)(terminate != 0);
  if ((terminate != 0) && (bVar28)) {
    htmlAutoCloseOnEnd(ctxt);
    uVar26 = 1;
    if ((ctxt->nameNr == 0) && (ctxt->instate != XML_PARSER_EOF)) {
LAB_0014e763:
      ctxt->instate = XML_PARSER_EOF;
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var9 = ctxt->sax->endDocument, p_Var9 != (endDocumentSAXFunc)0x0)) {
        (*p_Var9)(ctxt->userData);
      }
    }
  }
switchD_0014d922_caseD_ffffffff:
  if (((((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) &&
      (((char)uVar26 != '\0' ||
       ((ctxt->instate == XML_PARSER_EPILOG || (ctxt->instate == XML_PARSER_EOF)))))) &&
     (pxVar20 = xmlGetIntSubset(ctxt->myDoc), pxVar20 == (xmlDtdPtr)0x0)) {
    pxVar20 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                 (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                 (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
    ctxt->myDoc->intSubset = pxVar20;
  }
  if (terminate != 0) {
    xVar13 = ctxt->instate;
    if (xVar13 != XML_PARSER_EOF) {
      if ((xVar13 != XML_PARSER_MISC) && (xVar13 != XML_PARSER_EPILOG)) {
        ctxt->errNo = 5;
        ctxt->wellFormed = 0;
      }
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var9 = ctxt->sax->endDocument, p_Var9 != (endDocumentSAXFunc)0x0)) {
        (*p_Var9)(ctxt->userData);
      }
    }
    ctxt->instate = XML_PARSER_EOF;
  }
  return ctxt->errNo;
}

Assistant:

int
htmlParseChunk(htmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseChunk: context error\n", NULL, NULL);
	return(XML_ERR_INTERNAL_ERROR);
    }
    if ((size > 0) && (chunk != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->instate != XML_PARSER_EOF))  {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
	size_t cur = ctxt->input->cur - ctxt->input->base;
	int res;

	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
	if (res < 0) {
	    ctxt->errNo = XML_PARSER_EOF;
	    ctxt->disableSAX = 1;
	    return (XML_PARSER_EOF);
	}
#ifdef DEBUG_PUSH
	xmlGenericError(xmlGenericErrorContext, "HPP: pushed %d\n", size);
#endif

#if 0
	if ((terminate) || (ctxt->input->buf->buffer->use > 80))
	    htmlParseTryOrFinish(ctxt, terminate);
#endif
    } else if (ctxt->instate != XML_PARSER_EOF) {
	if ((ctxt->input != NULL) && ctxt->input->buf != NULL) {
	    xmlParserInputBufferPtr in = ctxt->input->buf;
	    if ((in->encoder != NULL) && (in->buffer != NULL) &&
		    (in->raw != NULL)) {
		int nbchars;
		size_t base = xmlBufGetInputBase(in->buffer, ctxt->input);
		size_t current = ctxt->input->cur - ctxt->input->base;

		nbchars = xmlCharEncInput(in, terminate);
		xmlBufSetInputBaseCur(in->buffer, ctxt->input, base, current);
		if (nbchars < 0) {
		    htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
			         "encoder error\n", NULL, NULL);
		    return(XML_ERR_INVALID_ENCODING);
		}
	    }
	}
    }
    htmlParseTryOrFinish(ctxt, terminate);
    if (terminate) {
	if ((ctxt->instate != XML_PARSER_EOF) &&
	    (ctxt->instate != XML_PARSER_EPILOG) &&
	    (ctxt->instate != XML_PARSER_MISC)) {
	    ctxt->errNo = XML_ERR_DOCUMENT_END;
	    ctxt->wellFormed = 0;
	}
	if (ctxt->instate != XML_PARSER_EOF) {
	    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
		ctxt->sax->endDocument(ctxt->userData);
	}
	ctxt->instate = XML_PARSER_EOF;
    }
    return((xmlParserErrors) ctxt->errNo);
}